

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Fme7_Apu.cpp
# Opt level: O2

void __thiscall Nes_Fme7_Apu::run_until(Nes_Fme7_Apu *this,blip_time_t end_time)

{
  uint8_t *puVar1;
  byte bVar2;
  byte bVar3;
  Blip_Buffer *buf;
  int iVar4;
  int delta;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  blip_time_t t;
  long lVar9;
  uint uVar10;
  int iVar11;
  
  for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
    buf = this->oscs[lVar9].output;
    if (buf != (Blip_Buffer *)0x0) {
      bVar2 = (this->super_fme7_apu_state_t).regs[lVar9 + 8];
      uVar10 = (uint)""[bVar2 & 0xf];
      bVar3 = (this->super_fme7_apu_state_t).regs[7];
      buf->modified_ = 1;
      if ((bVar2 & 0x10) != 0 || (bVar3 >> ((uint)lVar9 & 0x1f) & 1) != 0) {
        uVar10 = 0;
      }
      uVar6 = (uint)(this->super_fme7_apu_state_t).regs[lVar9 * 2] << 4 |
              ((this->super_fme7_apu_state_t).regs[lVar9 * 2 + 1] & 0xf) << 0xc;
      if (uVar6 < 0x32) {
        uVar10 = 0;
      }
      uVar8 = (ulong)uVar6;
      if (uVar6 == 0) {
        uVar8 = 0x10;
      }
      uVar6 = uVar10;
      if ((this->super_fme7_apu_state_t).phases[lVar9] == '\0') {
        uVar6 = 0;
      }
      t = this->last_time;
      iVar5 = uVar6 - this->oscs[lVar9].last_amp;
      if (iVar5 != 0) {
        this->oscs[lVar9].last_amp = uVar6;
        Blip_Synth<12,_1>::offset(&this->synth,t,iVar5,buf);
        t = this->last_time;
      }
      iVar5 = (uint)(this->super_fme7_apu_state_t).delays[lVar9] + t;
      if (iVar5 < end_time) {
        iVar7 = (int)uVar8;
        if (uVar10 == 0) {
          uVar8 = (uint)((end_time + -1 + iVar7) - iVar5) / uVar8;
          puVar1 = (this->super_fme7_apu_state_t).phases + lVar9;
          *puVar1 = *puVar1 ^ (byte)uVar8 & 1;
          iVar5 = iVar5 + (int)uVar8 * iVar7;
        }
        else {
          iVar4 = uVar10 + uVar6 * -2;
          iVar11 = uVar6 * 2 - uVar10;
          do {
            delta = iVar4;
            Blip_Synth<12,_1>::offset_inline(&this->synth,iVar5,delta,buf);
            iVar5 = iVar5 + iVar7;
            iVar4 = iVar11;
            iVar11 = delta;
          } while (iVar5 < end_time);
          this->oscs[lVar9].last_amp = (int)(uVar10 + delta) >> 1;
          (this->super_fme7_apu_state_t).phases[lVar9] = 0 < delta;
        }
      }
      (this->super_fme7_apu_state_t).delays[lVar9] = (short)iVar5 - (short)end_time;
    }
  }
  this->last_time = end_time;
  return;
}

Assistant:

void Nes_Fme7_Apu::run_until( blip_time_t end_time )
{
	require( end_time >= last_time );
	
	for ( int index = 0; index < osc_count; index++ )
	{
		int mode = regs [7] >> index;
		int vol_mode = regs [010 + index];
		int volume = amp_table [vol_mode & 0x0F];
		
		Blip_Buffer* const osc_output = oscs [index].output;
		if ( !osc_output )
			continue;
		osc_output->set_modified();
		
		// check for unsupported mode
		#ifndef NDEBUG
			if ( (mode & 011) <= 001 && vol_mode & 0x1F )
				debug_printf( "FME7 used unimplemented sound mode: %02X, vol_mode: %02X\n",
						mode, vol_mode & 0x1F );
		#endif
		
		if ( (mode & 001) | (vol_mode & 0x10) )
			volume = 0; // noise and envelope aren't supported
		
		// period
		int const period_factor = 16;
		unsigned period = (regs [index * 2 + 1] & 0x0F) * 0x100 * period_factor +
				regs [index * 2] * period_factor;
		if ( period < 50 ) // around 22 kHz
		{
			volume = 0;
			if ( !period ) // on my AY-3-8910A, period doesn't have extra one added
				period = period_factor;
		}
		
		// current amplitude
		int amp = volume;
		if ( !phases [index] )
			amp = 0;
		{
			int delta = amp - oscs [index].last_amp;
			if ( delta )
			{
				oscs [index].last_amp = amp;
				synth.offset( last_time, delta, osc_output );
			}
		}
		
		blip_time_t time = last_time + delays [index];
		if ( time < end_time )
		{
			int delta = amp * 2 - volume;
			if ( volume )
			{
				do
				{
					delta = -delta;
					synth.offset_inline( time, delta, osc_output );
					time += period;
				}
				while ( time < end_time );
				
				oscs [index].last_amp = (delta + volume) >> 1;
				phases [index] = (delta > 0);
			}
			else
			{
				// maintain phase when silent
				int count = (end_time - time + period - 1) / period;
				phases [index] ^= count & 1;
				time += (blargg_long) count * period;
			}
		}
		
		delays [index] = time - end_time;
	}
	
	last_time = end_time;
}